

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O3

void __thiscall FunctionCallNode::~FunctionCallNode(FunctionCallNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CallNode).super_ExpressionNode.super_Node._vptr_Node =
       (_func_int **)&PTR__FunctionCallNode_00150840;
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear(&(this->arguments_).
            super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
          );
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

FunctionCallNode(const std::string& name, 
    std::list<std::shared_ptr<ExpressionNode>> arguments):
      name_(name), arguments_(std::move(arguments)) {}